

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farmhash.cc
# Opt level: O3

uint32_t farmhashmk::Hash32(char *s,size_t len)

{
  int *piVar1;
  uint *puVar2;
  char *pcVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  size_t sVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  uVar8 = (uint)len;
  if (0x18 < len) {
    auVar13._8_4_ = 0xcc9e2d51;
    auVar13._0_8_ = 0xcc9e2d51cc9e2d51;
    auVar13._12_4_ = 0xcc9e2d51;
    auVar18._8_4_ = 0x16a88000;
    auVar18._0_8_ = 0x16a8800016a88000;
    auVar18._12_4_ = 0x16a88000;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = *(ulong *)(s + (len - 8));
    auVar15 = vpmulld_avx(auVar17,auVar13);
    auVar17 = vpmulld_avx(auVar17,auVar18);
    auVar20._8_8_ = 0;
    auVar20._0_8_ = *(ulong *)(s + (len - 0x10));
    auVar14 = vpmulld_avx(auVar20,auVar13);
    auVar13 = vpmulld_avx(auVar20,auVar18);
    auVar15 = vpsrld_avx(auVar15,0x11);
    auVar14 = vpsrld_avx(auVar14,0x11);
    auVar15 = vpor_avx(auVar15,auVar17);
    auVar16._8_4_ = 0x1b873593;
    auVar16._0_8_ = 0x1b8735931b873593;
    auVar16._12_4_ = 0x1b873593;
    auVar14 = vpor_avx(auVar14,auVar13);
    auVar19._8_4_ = 0xe6546b64;
    auVar19._0_8_ = 0xe6546b64e6546b64;
    auVar19._12_4_ = 0xe6546b64;
    auVar15 = vpshufd_avx(auVar15,0xe1);
    uVar5 = (*(int *)(s + (len - 0x14)) * 0x16a88000 |
            (uint)(*(int *)(s + (len - 0x14)) * -0x3361d2af) >> 0x11) * 0x1b873593 +
            uVar8 * -0x3361d2af;
    uVar5 = (uVar5 >> 0x13 | uVar5 * 0x2000) + 0x71;
    auVar17 = vpmulld_avx(auVar15,auVar16);
    auVar14 = vpmulld_avx(auVar14,auVar16);
    auVar15 = vpinsrd_avx(ZEXT416(uVar8),uVar8 * -0x3361d2af,1);
    auVar15 = vprold_avx512vl(auVar17 ^ auVar15,0xd);
    uVar6 = (len - 1) / 0x14;
    auVar17 = vpslld_avx(auVar15,2);
    auVar15 = vpaddd_avx(auVar15,auVar19);
    auVar15 = vpaddd_avx(auVar15,auVar17);
    auVar15 = vprold_avx512vl(auVar15 ^ auVar14,0xd);
    auVar17 = vpslld_avx(auVar15,2);
    auVar15 = vpaddd_avx(auVar15,auVar19);
    auVar15 = vpaddd_avx(auVar15,auVar17);
    auVar14._8_4_ = 0xe6546b64;
    auVar14._0_8_ = 0xe6546b64e6546b64;
    auVar14._12_4_ = 0xe6546b64;
    do {
      iVar11 = *(int *)((long)s + 0xc);
      iVar4 = *(int *)((long)s + 8);
      piVar1 = (int *)((long)s + 4);
      iVar10 = *(int *)s;
      puVar2 = (uint *)((long)s + 0x10);
      s = (char *)((long)s + 0x14);
      uVar7 = (iVar11 * 0x16a88000 | (uint)(iVar11 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              auVar15._0_4_ + iVar10;
      uVar8 = (iVar4 * 0x16a88000 | (uint)(iVar4 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              auVar15._4_4_ + *piVar1;
      iVar10 = (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + iVar10;
      auVar15 = vpinsrd_avx(ZEXT416((uVar7 >> 0x13 | uVar7 << 0xd) * 5),iVar10 + -0x19ab949c,1);
      iVar12 = *puVar2 * -0x3361d2af + *piVar1;
      auVar17 = vpinsrd_avx(ZEXT416(*puVar2),iVar11 + iVar10 + -0x33572938,1);
      uVar8 = (iVar12 * 0x16a88000 | (uint)(iVar12 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              uVar5 + iVar4;
      uVar6 = uVar6 - 1;
      auVar13 = vpinsrd_avx(auVar14,(uVar8 >> 0x13 | uVar8 << 0xd) * 5,1);
      auVar17 = vpaddd_avx(auVar17,auVar13);
      auVar15 = vpaddd_avx(auVar17,auVar15);
      uVar5 = auVar17._4_4_;
    } while (uVar6 != 0);
    uVar8 = auVar15._4_4_ >> 0xb;
    uVar8 = auVar15._0_4_ +
            (uVar8 * 0x16a88000 | (uVar8 | auVar15._4_4_ << 0x15) * -0x3361d2af >> 0x11) *
            -0x3361d2af;
    uVar8 = (uVar8 >> 0x13 | uVar8 * 0x2000) * 5 + 0xe6546b64;
    iVar11 = (uVar8 >> 0x11 | uVar8 * 0x8000) +
             ((uVar5 >> 0xb) * 0x16a88000 | (uVar5 >> 0xb | uVar5 << 0x15) * -0x3361d2af >> 0x11);
    uVar8 = (iVar11 * -0x3a55e000 | (uint)(iVar11 * -0x3361d2af) >> 0x13) * 5 + 0xe6546b64;
    return (uVar8 >> 0x11 | uVar8 * 0x8000) * -0x3361d2af;
  }
  if (len < 0xd) {
    if (len < 5) {
      if (len == 0) {
        uVar5 = 0;
        uVar7 = 9;
      }
      else {
        uVar7 = 9;
        uVar5 = 0;
        sVar9 = 0;
        do {
          pcVar3 = s + sVar9;
          sVar9 = sVar9 + 1;
          uVar5 = uVar5 * -0x3361d2af + (int)*pcVar3;
          uVar7 = uVar7 ^ uVar5;
        } while (len != sVar9);
      }
      uVar7 = (uVar8 * 0x16a88000 | uVar8 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar7;
      uVar8 = uVar7 >> 0x13 | uVar7 << 0xd;
    }
    else {
      iVar11 = *(int *)(s + (len - 4)) + uVar8 * 5;
      uVar5 = *(int *)(s + (ulong)(uVar8 >> 3 & 1) * 4) + 9;
      uVar8 = ((*(int *)s + uVar8) * 0x16a88000 | (*(int *)s + uVar8) * -0x3361d2af >> 0x11) *
              0x1b873593 ^ uVar8 * 5;
      uVar8 = (iVar11 * 0x16a88000 | (uint)(iVar11 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
              (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + 0xe6546b64;
      uVar8 = uVar8 >> 0x13 | uVar8 << 0xd;
    }
    uVar8 = (uVar5 * 0x16a88000 | uVar5 * -0x3361d2af >> 0x11) * 0x1b873593 ^ uVar8 * 5 + 0xe6546b64
    ;
    uVar8 = (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + 0xe6546b64;
    uVar8 = uVar8 >> 0x10 ^ uVar8;
  }
  else {
    iVar11 = *(int *)(s + (len - 8));
    uVar5 = (*(uint *)(s + ((len >> 1) - 4)) >> 0xc | *(uint *)(s + ((len >> 1) - 4)) << 0x14) +
            *(int *)(s + (len - 4));
    uVar8 = (iVar11 * 0x16a88000 | (uint)(iVar11 * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            uVar8 + *(int *)(s + (len >> 1)) * -0x3361d2af;
    iVar11 = (uVar5 >> 3 | uVar5 * 0x20000000) + iVar11;
    uVar8 = (*(int *)s * 0x16a88000 | (uint)(*(int *)s * -0x3361d2af) >> 0x11) * 0x1b873593 ^
            (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + uVar5 + 0xe6546b64;
    uVar5 = iVar11 + *(int *)(s + (len - 4));
    uVar8 = (*(int *)(s + 4) * 0x16a88000 | (uint)(*(int *)(s + 4) * -0x3361d2af) >> 0x11) *
            0x1b873593 ^ (uVar8 >> 0x13 | uVar8 << 0xd) * 5 + iVar11 + -0x19ab949c;
    uVar8 = (uVar5 >> 0xc | uVar5 * 0x100000) + *(int *)(s + (len >> 1)) + -0x19ab949c +
            (uVar8 >> 0x13 | uVar8 << 0xd) * 5;
    uVar8 = uVar8 >> 0x10 ^ uVar8;
  }
  uVar8 = (uVar8 * -0x7a143595 >> 0xd ^ uVar8 * -0x7a143595) * -0x3d4d51cb;
  return uVar8 >> 0x10 ^ uVar8;
}

Assistant:

uint32_t Hash32(const char *s, size_t len) {
  if (len <= 24) {
    return len <= 12 ?
        (len <= 4 ? Hash32Len0to4(s, len) : Hash32Len5to12(s, len)) :
        Hash32Len13to24(s, len);
  }

  // len > 24
  uint32_t h = len, g = c1 * len, f = g;
  uint32_t a0 = Rotate(Fetch(s + len - 4) * c1, 17) * c2;
  uint32_t a1 = Rotate(Fetch(s + len - 8) * c1, 17) * c2;
  uint32_t a2 = Rotate(Fetch(s + len - 16) * c1, 17) * c2;
  uint32_t a3 = Rotate(Fetch(s + len - 12) * c1, 17) * c2;
  uint32_t a4 = Rotate(Fetch(s + len - 20) * c1, 17) * c2;
  h ^= a0;
  h = Rotate(h, 19);
  h = h * 5 + 0xe6546b64;
  h ^= a2;
  h = Rotate(h, 19);
  h = h * 5 + 0xe6546b64;
  g ^= a1;
  g = Rotate(g, 19);
  g = g * 5 + 0xe6546b64;
  g ^= a3;
  g = Rotate(g, 19);
  g = g * 5 + 0xe6546b64;
  f += a4;
  f = Rotate(f, 19) + 113;
  size_t iters = (len - 1) / 20;
  do {
    uint32_t a = Fetch(s);
    uint32_t b = Fetch(s + 4);
    uint32_t c = Fetch(s + 8);
    uint32_t d = Fetch(s + 12);
    uint32_t e = Fetch(s + 16);
    h += a;
    g += b;
    f += c;
    h = Mur(d, h) + e;
    g = Mur(c, g) + a;
    f = Mur(b + e * c1, f) + d;
    f += g;
    g += f;
    s += 20;
  } while (--iters != 0);
  g = Rotate(g, 11) * c1;
  g = Rotate(g, 17) * c1;
  f = Rotate(f, 11) * c1;
  f = Rotate(f, 17) * c1;
  h = Rotate(h + g, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate(h, 17) * c1;
  h = Rotate(h + f, 19);
  h = h * 5 + 0xe6546b64;
  h = Rotate(h, 17) * c1;
  return h;
}